

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O2

int bbuf_clone(BBuf **rto,BBuf *from)

{
  uint uVar1;
  int iVar2;
  BBuf *buf;
  
  buf = (BBuf *)malloc(0x10);
  *rto = buf;
  if (buf == (BBuf *)0x0) {
    iVar2 = -5;
  }
  else {
    iVar2 = bbuf_init(buf,from->alloc);
    if (iVar2 == 0) {
      uVar1 = from->used;
      buf->used = uVar1;
      memcpy(buf->p,from->p,(ulong)uVar1);
      iVar2 = 0;
    }
    else {
      bbuf_free(buf);
      *rto = (BBuf *)0x0;
    }
  }
  return iVar2;
}

Assistant:

static int
bbuf_clone(BBuf** rto, BBuf* from)
{
  int r;
  BBuf *to;

  *rto = to = (BBuf* )xmalloc(sizeof(BBuf));
  CHECK_NULL_RETURN_MEMERR(to);
  r = BB_INIT(to, from->alloc);
  if (r != 0) {
    bbuf_free(to);
    *rto = 0;
    return r;
  }
  to->used = from->used;
  xmemcpy(to->p, from->p, from->used);
  return 0;
}